

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_path_unittest.cc
# Opt level: O2

void __thiscall GetUniquePathTest_OMPI_Test::TestBody(GetUniquePathTest_OMPI_Test *this)

{
  char *pcVar1;
  undefined1 local_140 [8];
  WithEnv withOMPI;
  WithEnv withTestVar;
  string expectedPath;
  WithEnv withForced;
  AssertionResult gtest_ar_2;
  allocator<char> local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  AssertHelper local_18;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(withOMPI.val.field_2._M_local_buf + 8),"OMPI_HOME",
             (allocator<char> *)(withTestVar.val.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expectedPath.field_2._M_local_buf + 8),"/some/path",
             (allocator<char> *)local_38);
  WithEnv::WithEnv((WithEnv *)local_140,(string *)((long)&withOMPI.val.field_2 + 8),
                   (string *)((long)&expectedPath.field_2 + 8));
  std::__cxx11::string::~string((string *)(expectedPath.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(withOMPI.val.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expectedPath.field_2._M_local_buf + 8),"GPROF_TEST_PATH",
             (allocator<char> *)local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(withTestVar.val.field_2._M_local_buf + 8),"/var/log/some_file_name",
             (allocator<char> *)(withForced.val.field_2._M_local_buf + 8));
  WithEnv::WithEnv((WithEnv *)((long)&withOMPI.val.field_2 + 8),
                   (string *)((long)&expectedPath.field_2 + 8),
                   (string *)((long)&withTestVar.val.field_2 + 8));
  std::__cxx11::string::~string((string *)(withTestVar.val.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(expectedPath.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expectedPath.field_2._M_local_buf + 8),"/var/log/some_file_name",
             (allocator<char> *)local_38);
  AppendPID((string *)((long)&withTestVar.val.field_2 + 8),
            (string *)((long)&expectedPath.field_2 + 8));
  std::__cxx11::string::~string((string *)(expectedPath.field_2._M_local_buf + 8));
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_38,"expectedPath","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withTestVar.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&expectedPath.field_2 + 8));
  std::__cxx11::string::~string((string *)(expectedPath.field_2._M_local_buf + 8));
  if (local_38[0] == (allocator<char>)0x0) {
    testing::Message::Message((Message *)((long)&expectedPath.field_2 + 8));
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0xad,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),
               (Message *)((long)&expectedPath.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8));
    if (expectedPath.field_2._8_8_ != 0) {
      (**(code **)(*(long *)expectedPath.field_2._8_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_38,"expectedPath","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withTestVar.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&expectedPath.field_2 + 8));
  std::__cxx11::string::~string((string *)(expectedPath.field_2._M_local_buf + 8));
  if (local_38[0] == (allocator<char>)0x0) {
    testing::Message::Message((Message *)((long)&expectedPath.field_2 + 8));
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0xb0,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),
               (Message *)((long)&expectedPath.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8));
    if (expectedPath.field_2._8_8_ != 0) {
      (**(code **)(*(long *)expectedPath.field_2._8_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  WithEnv::Reset((WithEnv *)((long)&withOMPI.val.field_2 + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"GPROF_TEST_PATH_USE_PID",(allocator<char> *)&local_18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(withForced.val.field_2._M_local_buf + 8),"1",&local_39);
  WithEnv::WithEnv((WithEnv *)((long)&expectedPath.field_2 + 8),(string *)local_38,
                   (string *)((long)&withForced.val.field_2 + 8));
  std::__cxx11::string::~string((string *)(withForced.val.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_38);
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(withForced.val.field_2._M_local_buf + 8),"expectedPath","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withTestVar.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  if (withForced.val.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)local_38);
    if (gtest_ar_2._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_2._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0xb6,pcVar1);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((long *)CONCAT71(local_38._1_7_,local_38[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_38._1_7_,local_38[0]) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_2);
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(withForced.val.field_2._M_local_buf + 8),"expectedPath","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withTestVar.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  if (withForced.val.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)local_38);
    if (gtest_ar_2._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_2._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0xb9,pcVar1);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((long *)CONCAT71(local_38._1_7_,local_38[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_38._1_7_,local_38[0]) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_2);
  WithEnv::~WithEnv((WithEnv *)((long)&expectedPath.field_2 + 8));
  std::__cxx11::string::~string((string *)(withTestVar.val.field_2._M_local_buf + 8));
  WithEnv::~WithEnv((WithEnv *)((long)&withOMPI.val.field_2 + 8));
  WithEnv::~WithEnv((WithEnv *)local_140);
  return;
}

Assistant:

TEST(GetUniquePathTest, OMPI) {
  WithEnv withOMPI("OMPI_HOME", "/some/path");
  WithEnv withTestVar(TEST_VAR, TEST_VAL);

  const auto expectedPath = AppendPID(TEST_VAL);

  // Test parent case (will set the child flag)
  EXPECT_EQ(expectedPath, GetTestPath());

  // Test child case
  EXPECT_EQ(expectedPath, GetTestPath());

  withTestVar.Reset();
  WithEnv withForced(TEST_VAR "_USE_PID", "1");

  // Test parent case (will set the child flag)
  EXPECT_EQ(expectedPath, GetTestPath());

  // Test child case
  EXPECT_EQ(expectedPath, GetTestPath());
}